

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasePort.cpp
# Opt level: O0

bool __thiscall BasePort::ScanNodes(BasePort *this)

{
  bool bVar1;
  _Setfill<char> _Var2;
  int iVar3;
  uint uVar4;
  _Setw _Var5;
  ostream *poVar6;
  void *pvVar7;
  unsigned_long uVar8;
  bool bVar9;
  bool local_94;
  undefined1 local_90 [4];
  bool showSHA;
  uint8_t git_flag;
  bool git_commits;
  bool git_dirty;
  string local_60;
  uint local_3c;
  ulong uStack_38;
  uint32_t git_desc;
  unsigned_long fpga_ver;
  unsigned_long fver;
  unsigned_long hver;
  ushort local_18;
  ushort local_16;
  quadlet_t data;
  nodeid_t max_nodes;
  nodeid_t node;
  uint board;
  BasePort *this_local;
  
  _max_nodes = this;
  memset(this->Node2Board,0x10,0x40);
  this->IsAllBoardsBroadcastCapable_ = true;
  this->IsAllBoardsRev4_5_ = true;
  this->IsAllBoardsRev4_6_ = true;
  this->IsAllBoardsRev6_ = true;
  this->IsAllBoardsRev7_ = true;
  this->IsAllBoardsRev8_9_ = true;
  this->NumOfNodes_ = 0;
  iVar3 = (*this->_vptr_BasePort[2])();
  local_18 = (ushort)iVar3;
  poVar6 = std::operator<<(this->outStr,"BasePort::ScanNodes: building node map for ");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_18);
  poVar6 = std::operator<<(poVar6," nodes:");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  local_16 = 0;
  do {
    if (local_18 <= local_16) {
      poVar6 = std::operator<<(this->outStr,"BasePort::ScanNodes: found ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,this->NumOfNodes_);
      poVar6 = std::operator<<(poVar6," boards");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      for (data = 0; data < 0x10; data = data + 1) {
        this->Board2Node[data] = 0x40;
        for (local_16 = 0; local_16 < local_18; local_16 = local_16 + 1) {
          if (this->Node2Board[local_16] == data) {
            if (this->Board2Node[data] < 0x40) {
              poVar6 = std::operator<<(this->outStr,
                                       "BasePort::ScanNodes: warning: duplicate node id for board ")
              ;
              poVar6 = (ostream *)std::ostream::operator<<(poVar6,data);
              poVar6 = std::operator<<(poVar6,"(");
              poVar6 = (ostream *)std::ostream::operator<<(poVar6,this->Board2Node[data]);
              poVar6 = std::operator<<(poVar6,", ");
              poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_16);
              poVar6 = std::operator<<(poVar6,")");
              std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
            }
            this->Board2Node[data] = local_16;
          }
        }
      }
      return this->NumOfNodes_ != 0;
    }
    fver = 0;
    uVar4 = (*this->_vptr_BasePort[4])(this,(ulong)local_16,4,(long)&hver + 4,0);
    if ((uVar4 & 1) == 0) {
      iVar3 = (*this->_vptr_BasePort[0xf])();
      if (iVar3 == 0) {
        poVar6 = std::operator<<(this->outStr,"BasePort::ScanNodes: unable to read from node ");
        pvVar7 = (void *)std::ostream::operator<<(poVar6,local_16);
        std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
      }
    }
    else {
      fver = (unsigned_long)hver._4_4_;
      bVar1 = HardwareVersionValid(fver);
      if (bVar1) {
        fpga_ver = 0;
        uVar4 = (*this->_vptr_BasePort[4])(this,(ulong)local_16,7,(long)&hver + 4);
        if ((uVar4 & 1) == 0) {
          poVar6 = std::operator<<(this->outStr,
                                   "BasePort::ScanNodes: unable to read firmware version from node "
                                  );
          pvVar7 = (void *)std::ostream::operator<<(poVar6,local_16);
          std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
        }
        else {
          fpga_ver = (unsigned_long)hver._4_4_;
          uStack_38 = 1;
          if (4 < fpga_ver) {
            uVar4 = (*this->_vptr_BasePort[4])(this,(ulong)local_16,0xc,(long)&hver + 4);
            if ((uVar4 & 1) == 0) {
              poVar6 = std::operator<<(this->outStr,
                                       "BasePort::ScanNodes: unable to read FPGA version (ETH_STATUS) from node "
                                      );
              pvVar7 = (void *)std::ostream::operator<<(poVar6,local_16);
              std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
              goto LAB_0011b7c3;
            }
            uVar4 = BoardIO::GetFpgaVersionMajorFromStatus(hver._4_4_);
            uStack_38 = (ulong)uVar4;
          }
          uVar4 = (*this->_vptr_BasePort[4])(this,(ulong)local_16,0,(long)&hver + 4);
          if ((uVar4 & 1) == 0) {
            poVar6 = std::operator<<(this->outStr,
                                     "BasePort::ScanNodes: unable to read status from node ");
            pvVar7 = (void *)std::ostream::operator<<(poVar6,local_16);
            std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
          }
          else {
            data = hver._4_4_ >> 0x18 & 0xf;
            this->FpgaVersion[data] = (uint)uStack_38;
            this->HardwareVersion[data] = fver;
            this->FirmwareVersion[data] = fpga_ver;
            local_3c = 0;
            uVar4 = (*this->_vptr_BasePort[4])(this,(ulong)local_16,0xf,&local_3c);
            if ((uVar4 & 1) == 0) {
              poVar6 = std::operator<<(this->outStr,
                                       "BasePort::ScanNodes: unable to read git desc from node ");
              pvVar7 = (void *)std::ostream::operator<<(poVar6,local_16);
              std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
            }
            poVar6 = std::operator<<(this->outStr,"  Node ");
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_16);
            poVar6 = std::operator<<(poVar6,", BoardId = ");
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,data);
            poVar6 = std::operator<<(poVar6,", ");
            GetFpgaVersionMajorString_abi_cxx11_(&local_60,this,(uchar)data);
            poVar6 = std::operator<<(poVar6,(string *)&local_60);
            poVar6 = std::operator<<(poVar6,", Hardware = ");
            GetHardwareVersionString_abi_cxx11_((string *)local_90,this,(uchar)data);
            poVar6 = std::operator<<(poVar6,(string *)local_90);
            poVar6 = std::operator<<(poVar6,", Firmware Version = ");
            uVar8 = GetFirmwareVersion(this,(uchar)data);
            std::ostream::operator<<(poVar6,uVar8);
            std::__cxx11::string::~string((string *)local_90);
            std::__cxx11::string::~string((string *)&local_60);
            if (local_3c != 0) {
              bVar1 = (local_3c & 8) != 0;
              bVar9 = (local_3c & 4) != 0;
              local_94 = true;
              if ((local_3c & 3) == 0) {
                if (bVar1 || bVar9) {
                  std::operator<<(this->outStr,"+");
                }
                local_94 = bVar1 || bVar9;
              }
              else if (((byte)local_3c & 3) == 1) {
                std::operator<<(this->outStr,"-");
              }
              else {
                std::operator<<(this->outStr,"?");
              }
              if (local_94) {
                poVar6 = std::operator<<(this->outStr," (git-");
                poVar6 = (ostream *)std::ostream::operator<<(poVar6,std::hex);
                _Var5 = std::setw(7);
                poVar6 = std::operator<<(poVar6,_Var5);
                _Var2 = std::setfill<char>('0');
                poVar6 = std::operator<<(poVar6,_Var2._M_c);
                pvVar7 = (void *)std::ostream::operator<<(poVar6,local_3c >> 4);
                std::ostream::operator<<(pvVar7,std::dec);
                if (bVar1) {
                  std::operator<<(this->outStr,"*");
                }
                std::operator<<(this->outStr,")");
              }
            }
            std::ostream::operator<<(this->outStr,std::endl<char,std::char_traits<char>>);
            if (this->Node2Board[local_16] < 0x10) {
              poVar6 = std::operator<<(this->outStr,"    Duplicate entry, previous value = ");
              pvVar7 = (void *)std::ostream::operator<<(poVar6,(uint)this->Node2Board[local_16]);
              std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
            }
            this->Node2Board[local_16] = (uchar)data;
            if (fpga_ver < 4) {
              this->IsAllBoardsBroadcastCapable_ = false;
              this->IsAllBoardsRev4_5_ = false;
              this->IsAllBoardsRev4_6_ = false;
            }
            if (5 < fpga_ver) {
              this->IsAllBoardsRev4_5_ = false;
            }
            if (6 < fpga_ver) {
              this->IsAllBoardsRev4_6_ = false;
            }
            if (fpga_ver != 6) {
              this->IsAllBoardsRev6_ = false;
            }
            if (fpga_ver != 7) {
              this->IsAllBoardsRev7_ = false;
            }
            if ((fpga_ver != 8) && (fpga_ver != 9)) {
              this->IsAllBoardsRev8_9_ = false;
            }
            this->NumOfNodes_ = this->NumOfNodes_ + 1;
          }
        }
      }
      else {
        poVar6 = std::operator<<(this->outStr,"BasePort::ScanNodes: node ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_16);
        poVar6 = std::operator<<(poVar6," is not a supported board (data = ");
        pvVar7 = (void *)std::ostream::operator<<(poVar6,std::hex);
        pvVar7 = (void *)std::ostream::operator<<(pvVar7,hver._4_4_);
        poVar6 = (ostream *)std::ostream::operator<<(pvVar7,std::dec);
        poVar6 = std::operator<<(poVar6,")");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      }
    }
LAB_0011b7c3:
    local_16 = local_16 + 1;
  } while( true );
}

Assistant:

bool BasePort::ScanNodes(void)
{
    unsigned int board;
    nodeid_t node;

    // Clear any existing Node2Board
    memset(Node2Board, BoardIO::MAX_BOARDS, sizeof(Node2Board));

    IsAllBoardsBroadcastCapable_ = true;
    IsAllBoardsRev4_5_ = true;
    IsAllBoardsRev4_6_ = true;
    IsAllBoardsRev6_ = true;
    IsAllBoardsRev7_ = true;
    IsAllBoardsRev8_9_ = true;
    NumOfNodes_ = 0;

    nodeid_t max_nodes = InitNodes();

    outStr << "BasePort::ScanNodes: building node map for " << max_nodes << " nodes:" << std::endl;
    // Iterate through all possible nodes
    for (node = 0; node < max_nodes; node++) {
        quadlet_t data;
        unsigned long hver = 0;
        // check hardware version
        if (!ReadQuadletNode(node, BoardIO::HARDWARE_VERSION, data)) {
            if (GetPortType() == PORT_FIREWIRE)
                outStr << "BasePort::ScanNodes: unable to read from node " << node << std::endl;
            continue;
        }
        hver = data;

        if (!HardwareVersionValid(hver)) {
            outStr << "BasePort::ScanNodes: node " << node << " is not a supported board (data = "
                   << std::hex << data << std::dec << ")" << std::endl;
            continue;
        }

        // read firmware version
        unsigned long fver = 0;
        if (!ReadQuadletNode(node, BoardIO::FIRMWARE_VERSION, data)) {
            outStr << "BasePort::ScanNodes: unable to read firmware version from node "
                   << node << std::endl;
            continue;
        }
        fver = data;

        // read FPGA version (for Firmware Rev 5+)
        unsigned long fpga_ver = 1;
        if (fver >= 5) {
            if (!ReadQuadletNode(node, BoardIO::ETH_STATUS, data)) {
                outStr << "BasePort::ScanNodes: unable to read FPGA version (ETH_STATUS) from node "
                       << node << std::endl;
                continue;
            }
            fpga_ver = BoardIO::GetFpgaVersionMajorFromStatus(data);
        }

        // read board id
        if (!ReadQuadletNode(node, BoardIO::BOARD_STATUS, data)) {
            outStr << "BasePort::ScanNodes: unable to read status from node " << node << std::endl;
            continue;
        }
        // board_id is bits 27-24, BOARD_ID_MASK = 0x0F000000
        board = (data & BOARD_ID_MASK) >> 24;
        FpgaVersion[board] = fpga_ver;
        HardwareVersion[board] = hver;
        FirmwareVersion[board] = fver;

        // read git description (introduced after Rev 8 release)
        uint32_t git_desc = 0;
        if (!ReadQuadletNode(node, BoardIO::GIT_DESC, git_desc)) {
            outStr << "BasePort::ScanNodes: unable to read git desc from node " << node << std::endl;
        }
        outStr << "  Node " << node << ", BoardId = " << board
               << ", " << GetFpgaVersionMajorString(board)
               << ", Hardware = " << GetHardwareVersionString(board)
               << ", Firmware Version = " << GetFirmwareVersion(board);

        if (git_desc != 0) {
            // git_dirty bit indicates that firmware was built with uncommitted changes;
            // shown by appending * to the git SHA.
            bool git_dirty = git_desc&0x00000008;
            // git_commits bit indicates whether there were any commits since the last tag
            bool git_commits = git_desc&0x00000004;
            // git_flag is set by the firmware, based on comparing the firmware version (F) to
            // the most recent git tag ("RevG", where G is the git tag version)
            //    0:  F == G     actual release ("F") or update to last release ("F+"),
            //                   depending on git_dirty and git_commits
            //    1:  F == G+1   new firmware preview, shown as "F-"
            //    2:  F > G+1    should not happen (missing git tag?), shown as "F?"
            //    3:  F < G      should not happen, shown as "F?"
            uint8_t git_flag = git_desc&0x00000003;
            bool showSHA = true;
            if (git_flag == 0) {
                if (git_dirty|git_commits)
                    outStr << "+";
                else
                    showSHA = false;
            }
            else if (git_flag == 1)
                outStr << "-";
            else
                outStr << "?";
            if (showSHA) {
                outStr << " (git-" << std::hex << std::setw(7) << std::setfill('0')
                       << (git_desc>>4) << std::dec;
                if (git_dirty)
                    outStr << "*";
                outStr << ")";
            }
        }
        outStr << std::endl;

        if (Node2Board[node] < BoardIO::MAX_BOARDS) {
            outStr << "    Duplicate entry, previous value = "
                   << static_cast<int>(Node2Board[node]) << std::endl;
        }
        Node2Board[node] = static_cast<unsigned char>(board);

        // check firmware version
        // Firmware Version >= 4, broadcast capable
        if (fver < 4) {
            IsAllBoardsBroadcastCapable_ = false;
            IsAllBoardsRev4_5_ = false;
            IsAllBoardsRev4_6_ = false;
        }
        if (fver > 5) IsAllBoardsRev4_5_ = false;
        if (fver > 6) IsAllBoardsRev4_6_ = false;
        // Firmware Version 6, broadcast with possibly shorter wait (i.e., skipping nodes
        // on the bus that are not part of the current configuration).
        if (fver != 6) IsAllBoardsRev6_ = false;
        // Firmware Version 7, added power control to block write; added velocity estimation
        // fields to block read
        if (fver != 7) IsAllBoardsRev7_ = false;
        // Firmware Version 8, added header quadlet to block write; support larger entries in
        // block read (both changes to support dRAC).
        if ((fver != 8) && (fver != 9)) IsAllBoardsRev8_9_ = false;
        NumOfNodes_++;
    }
    outStr << "BasePort::ScanNodes: found " << NumOfNodes_ << " boards" << std::endl;

    // update Board2Node
    for (board = 0; board < BoardIO::MAX_BOARDS; board++) {
        Board2Node[board] = MAX_NODES;
        // search up to max_nodes (not NumOfNodes_) in case nodes are not sequential (i.e., if some nodes
        // are not associated with valid boards).
        for (node = 0; node < max_nodes; node++) {
            if (Node2Board[node] == board) {
                if (Board2Node[board] < MAX_NODES)
                    outStr << "BasePort::ScanNodes: warning: duplicate node id for board " << board
                           << "(" << Board2Node[board] << ", " << node << ")" << std::endl;
                Board2Node[board] = node;
            }
        }
    }

    return (NumOfNodes_ > 0);
}